

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

bool Am_Object_Valid_And_Not_Part(Am_Object *obj)

{
  bool bVar1;
  bool bVar2;
  Am_Value *this;
  Am_Object AStack_18;
  
  bVar1 = Am_Object::Valid(obj);
  bVar2 = false;
  if (bVar1) {
    this = Am_Object::Get(obj,0x69,0);
    bVar1 = Am_Value::operator_cast_to_bool(this);
    bVar2 = false;
    if (bVar1) {
      Am_Object::Get_Owner(&AStack_18,(Am_Slot_Flags)obj);
      bVar2 = Am_Object::Valid(&AStack_18);
      Am_Object::~Am_Object(&AStack_18);
      bVar2 = !bVar2;
    }
  }
  return bVar2;
}

Assistant:

bool
Am_Object_Valid_And_Not_Part(Am_Object obj)
{
  if (!obj.Valid())
    return false;
  if (!(bool)obj.Get(Am_VISIBLE))
    return false;
  if (obj.Get_Owner().Valid())
    return false; // shouldn't have an owner
  return true;
}